

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  void *pvVar76;
  void *pvVar77;
  Mat *pMVar78;
  int _c;
  int iVar79;
  int iVar80;
  int iVar81;
  long lVar82;
  int iVar83;
  int iVar84;
  long lVar85;
  float *pfVar86;
  undefined1 (*pauVar87) [32];
  int _h;
  int iVar88;
  uint uVar89;
  undefined1 (*pauVar90) [32];
  int iVar91;
  ulong uVar92;
  undefined4 *puVar93;
  undefined1 (*pauVar94) [32];
  undefined1 (*pauVar95) [32];
  undefined1 (*pauVar96) [32];
  undefined1 (*pauVar97) [32];
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  ulong uVar103;
  ulong uVar104;
  int iVar105;
  uint uVar106;
  uint _w;
  bool bVar107;
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  float fVar138;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  float fVar143;
  undefined1 auVar141 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar142 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 (*local_1f0) [32];
  undefined1 (*local_1e0) [32];
  int stride;
  undefined1 (*local_1d0) [32];
  undefined1 (*local_1c0) [32];
  undefined1 (*local_1b8) [32];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  Mat local_178;
  void *local_130;
  Mat *local_128;
  undefined1 (*local_120) [32];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  Mat bottom_tm;
  float zeros [8];
  Mat bottom_im2col;
  
  iVar80 = bottom_blob->w;
  iVar81 = bottom_blob->c;
  uVar89 = top_blob->w;
  iVar91 = top_blob->h;
  local_130 = _bias->data;
  _w = iVar91 * uVar89;
  iVar105 = kernel_h * kernel_w;
  _h = iVar81 * iVar105;
  local_120 = (undefined1 (*) [32])bottom_blob->elemsize;
  uVar106 = top_blob->c;
  local_f0 = (ulong)(int)uVar106;
  local_128 = top_blob;
  Mat::Mat(&bottom_im2col,_w,_h,(size_t)local_120,opt->workspace_allocator);
  uVar103 = 0;
  uVar92 = (ulong)uVar89;
  if ((int)uVar89 < 1) {
    uVar92 = uVar103;
  }
  if (iVar91 < 1) {
    iVar91 = 0;
  }
  if (kernel_w < 1) {
    kernel_w = 0;
  }
  if (kernel_h < 1) {
    kernel_h = 0;
  }
  iVar83 = 0;
  if (0 < iVar81) {
    iVar83 = iVar81;
  }
  while( true ) {
    _c = (int)uVar103;
    if (_c == iVar83) break;
    Mat::channel(&bottom_tm,bottom_blob,_c);
    pvVar76 = bottom_tm.data;
    Mat::~Mat(&bottom_tm);
    iVar79 = _w * iVar105 * _c;
    iVar100 = 0;
    for (iVar88 = 0; iVar88 != kernel_h; iVar88 = iVar88 + 1) {
      local_118._0_4_ = iVar100;
      iVar99 = iVar100;
      for (iVar98 = 0; iVar98 != kernel_w; iVar98 = iVar98 + 1) {
        iVar102 = iVar99;
        for (iVar101 = 0; iVar101 != iVar91; iVar101 = iVar101 + 1) {
          iVar84 = iVar102;
          for (uVar103 = 0; uVar92 != uVar103; uVar103 = uVar103 + 1) {
            *(undefined4 *)((long)bottom_im2col.data + uVar103 * 4 + (long)iVar79 * 4) =
                 *(undefined4 *)((long)pvVar76 + (long)iVar84 * 4);
            iVar84 = iVar84 + stride_w;
          }
          iVar79 = iVar79 + (int)uVar103;
          iVar102 = iVar102 + stride_h * iVar80;
        }
        iVar99 = iVar99 + 1;
      }
      iVar100 = iVar100 + iVar80;
    }
    uVar103 = (ulong)(_c + 1);
  }
  Mat::Mat(&bottom_tm,iVar105 * 8,iVar81,((int)_w / 8) * -7 + _w,(size_t)local_120,
           opt->workspace_allocator);
  lVar85 = (long)(int)_w;
  uVar92 = 0;
  iVar80 = 0;
  if (0 < _h) {
    iVar80 = _h;
  }
  local_118._0_4_ = iVar80;
  uVar103 = (ulong)(uint)((int)_w >> 3);
  if ((int)_w >> 3 < 1) {
    uVar103 = uVar92;
  }
  for (uVar104 = 0; uVar104 != uVar103; uVar104 = uVar104 + 1) {
    Mat::channel(&local_178,&bottom_im2col,0);
    pvVar76 = local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,&bottom_tm,(int)uVar104);
    pauVar97 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    pauVar87 = (undefined1 (*) [32])((undefined1 *)pvVar76 + uVar92);
    iVar80 = local_118._0_4_;
    while (bVar107 = iVar80 != 0, iVar80 = iVar80 + -1, bVar107) {
      *pauVar97 = *pauVar87;
      pauVar97 = pauVar97 + 1;
      pauVar87 = (undefined1 (*) [32])(*pauVar87 + lVar85 * 4);
    }
    uVar92 = uVar92 + 0x20;
  }
  uVar92 = (ulong)(int)(_w & 0xfffffff8);
  uVar18 = local_118._0_4_;
  lVar1 = uVar92 * 4;
  for (; (long)uVar92 < lVar85; uVar92 = uVar92 + 1) {
    Mat::channel(&local_178,&bottom_im2col,0);
    pvVar76 = local_178.data;
    Mat::~Mat(&local_178);
    uVar103 = (ulong)(uint)((int)uVar92 >> 0x1f) << 0x20 | uVar92 & 0xffffffff;
    Mat::channel(&local_178,&bottom_tm,(int)((long)uVar103 % 8) + (int)((long)uVar103 / 8));
    pvVar77 = local_178.data;
    Mat::~Mat(&local_178);
    puVar93 = (undefined4 *)((undefined1 *)pvVar76 + lVar1);
    for (lVar82 = 0; uVar18 != (int)lVar82; lVar82 = lVar82 + 1) {
      *(undefined4 *)((undefined1 *)pvVar77 + lVar82 * 4) = *puVar93;
      puVar93 = puVar93 + lVar85;
    }
    lVar1 = lVar1 + 4;
  }
  local_f8 = local_f0 & 0xfffffffffffffff8;
  uVar92 = 0;
  local_e8 = (ulong)(uint)((int)uVar106 >> 3);
  if ((int)uVar106 >> 3 < 1) {
    local_e8 = uVar92;
  }
  for (; pMVar78 = local_128, uVar92 != local_e8; uVar92 = uVar92 + 1) {
    iVar80 = (int)uVar92;
    uVar89 = iVar80 * 8;
    Mat::channel(&local_178,local_128,uVar89);
    pauVar97 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 1);
    pauVar87 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 2);
    pauVar90 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 3);
    local_1f0 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 4);
    local_1e0 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 5);
    local_1d0 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 6);
    local_1b8 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar89 | 7);
    local_1c0 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    pfVar86 = (float *)((long)local_130 + uVar92 * 0x20);
    if (local_130 == (void *)0x0) {
      pfVar86 = zeros;
    }
    for (uVar89 = 0; (int)(uVar89 | 7) < (int)_w; uVar89 = uVar89 + 8) {
      Mat::channel(&local_178,&bottom_tm,uVar89 >> 3);
      pauVar96 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,iVar80);
      pauVar95 = (undefined1 (*) [32])local_178.data;
      local_120 = pauVar97;
      Mat::~Mat(&local_178);
      fVar108 = *pfVar86;
      auVar123._4_4_ = fVar108;
      auVar123._0_4_ = fVar108;
      auVar123._8_4_ = fVar108;
      auVar123._12_4_ = fVar108;
      auVar123._16_4_ = fVar108;
      auVar123._20_4_ = fVar108;
      auVar123._24_4_ = fVar108;
      auVar123._28_4_ = fVar108;
      fVar108 = pfVar86[1];
      auVar133._4_4_ = fVar108;
      auVar133._0_4_ = fVar108;
      auVar133._8_4_ = fVar108;
      auVar133._12_4_ = fVar108;
      auVar133._16_4_ = fVar108;
      auVar133._20_4_ = fVar108;
      auVar133._24_4_ = fVar108;
      auVar133._28_4_ = fVar108;
      fVar108 = pfVar86[2];
      auVar147._4_4_ = fVar108;
      auVar147._0_4_ = fVar108;
      auVar147._8_4_ = fVar108;
      auVar147._12_4_ = fVar108;
      auVar147._16_4_ = fVar108;
      auVar147._20_4_ = fVar108;
      auVar147._24_4_ = fVar108;
      auVar147._28_4_ = fVar108;
      fVar108 = pfVar86[3];
      fVar115 = pfVar86[4];
      auVar140._4_4_ = fVar115;
      auVar140._0_4_ = fVar115;
      auVar140._8_4_ = fVar115;
      auVar140._12_4_ = fVar115;
      auVar140._16_4_ = fVar115;
      auVar140._20_4_ = fVar115;
      auVar140._24_4_ = fVar115;
      auVar140._28_4_ = fVar115;
      fVar115 = pfVar86[5];
      auVar149._4_4_ = fVar115;
      auVar149._0_4_ = fVar115;
      auVar149._8_4_ = fVar115;
      auVar149._12_4_ = fVar115;
      auVar149._16_4_ = fVar115;
      auVar149._20_4_ = fVar115;
      auVar149._24_4_ = fVar115;
      auVar149._28_4_ = fVar115;
      fVar115 = pfVar86[6];
      auVar151._4_4_ = fVar115;
      auVar151._0_4_ = fVar115;
      auVar151._8_4_ = fVar115;
      auVar151._12_4_ = fVar115;
      auVar151._16_4_ = fVar115;
      auVar151._20_4_ = fVar115;
      auVar151._24_4_ = fVar115;
      auVar151._28_4_ = fVar115;
      fVar115 = pfVar86[7];
      auVar127._4_4_ = fVar115;
      auVar127._0_4_ = fVar115;
      auVar127._8_4_ = fVar115;
      auVar127._12_4_ = fVar115;
      auVar127._16_4_ = fVar115;
      auVar127._20_4_ = fVar115;
      auVar127._24_4_ = fVar115;
      auVar127._28_4_ = fVar115;
      fVar115 = fVar108;
      fVar116 = fVar108;
      fVar117 = fVar108;
      fVar118 = fVar108;
      fVar119 = fVar108;
      fVar120 = fVar108;
      fVar122 = fVar108;
      for (iVar81 = 0; iVar81 + 3 < _h; iVar81 = iVar81 + 4) {
        fVar3 = *(float *)*pauVar95;
        fVar161 = *(float *)(*pauVar95 + 4);
        fVar162 = *(float *)(*pauVar95 + 8);
        fVar163 = *(float *)(*pauVar95 + 0xc);
        fVar167 = *(float *)*pauVar96;
        fVar168 = *(float *)(*pauVar96 + 4);
        fVar169 = *(float *)(*pauVar96 + 8);
        fVar170 = *(float *)(*pauVar96 + 0xc);
        fVar52 = *(float *)(*pauVar96 + 0x10);
        fVar53 = *(float *)(*pauVar96 + 0x14);
        fVar54 = *(float *)(*pauVar96 + 0x18);
        fVar55 = *(float *)pauVar96[1];
        fVar56 = *(float *)(pauVar96[1] + 4);
        fVar57 = *(float *)(pauVar96[1] + 8);
        fVar58 = *(float *)(pauVar96[1] + 0xc);
        fVar59 = *(float *)(pauVar96[1] + 0x10);
        fVar60 = *(float *)(pauVar96[1] + 0x14);
        fVar61 = *(float *)(pauVar96[1] + 0x18);
        fVar19 = auVar123._4_4_;
        fVar25 = auVar123._8_4_;
        fVar31 = auVar123._12_4_;
        fVar37 = auVar123._16_4_;
        fVar43 = auVar123._20_4_;
        fVar49 = auVar123._24_4_;
        fVar164 = auVar123._28_4_;
        fVar20 = auVar133._4_4_;
        fVar26 = auVar133._8_4_;
        fVar32 = auVar133._12_4_;
        fVar38 = auVar133._16_4_;
        fVar44 = auVar133._20_4_;
        fVar50 = auVar133._24_4_;
        fVar165 = auVar133._28_4_;
        fVar21 = auVar147._4_4_;
        fVar27 = auVar147._8_4_;
        fVar33 = auVar147._12_4_;
        fVar39 = auVar147._16_4_;
        fVar45 = auVar147._20_4_;
        fVar51 = auVar147._24_4_;
        fVar166 = auVar147._28_4_;
        fVar153 = *(float *)(*pauVar95 + 0x10);
        fVar154 = *(float *)(*pauVar95 + 0x14);
        fVar155 = *(float *)(*pauVar95 + 0x18);
        fVar156 = *(float *)(*pauVar95 + 0x1c);
        fVar22 = auVar140._4_4_;
        fVar28 = auVar140._8_4_;
        fVar34 = auVar140._12_4_;
        fVar40 = auVar140._16_4_;
        fVar46 = auVar140._20_4_;
        fVar144 = auVar140._24_4_;
        fVar143 = fVar122 + auVar140._28_4_;
        fVar23 = auVar149._4_4_;
        fVar29 = auVar149._8_4_;
        fVar35 = auVar149._12_4_;
        fVar41 = auVar149._16_4_;
        fVar47 = auVar149._20_4_;
        fVar145 = auVar149._24_4_;
        fVar138 = fVar122 + auVar149._28_4_;
        fVar24 = auVar151._4_4_;
        fVar30 = auVar151._8_4_;
        fVar36 = auVar151._12_4_;
        fVar42 = auVar151._16_4_;
        fVar48 = auVar151._20_4_;
        fVar146 = auVar151._24_4_;
        fVar121 = fVar122 + auVar151._28_4_;
        fVar157 = *(float *)pauVar95[1];
        fVar158 = *(float *)(pauVar95[1] + 4);
        fVar159 = *(float *)(pauVar95[1] + 8);
        local_118._0_4_ = fVar167 * fVar156 + auVar127._0_4_;
        local_118._4_4_ = fVar168 * fVar156 + auVar127._4_4_;
        fStack_110 = fVar169 * fVar156 + auVar127._8_4_;
        fStack_10c = fVar170 * fVar156 + auVar127._12_4_;
        fStack_108 = fVar52 * fVar156 + auVar127._16_4_;
        fStack_104 = fVar53 * fVar156 + auVar127._20_4_;
        fStack_100 = fVar54 * fVar156 + auVar127._24_4_;
        fStack_fc = fVar156 + auVar127._28_4_;
        fVar4 = *(float *)(pauVar95[1] + 0xc);
        fVar5 = *(float *)(pauVar95[1] + 0x10);
        fVar6 = *(float *)(pauVar95[1] + 0x14);
        fVar7 = *(float *)(pauVar95[1] + 0x18);
        fVar8 = *(float *)(pauVar95[1] + 0x1c);
        fVar62 = *(float *)pauVar96[2];
        fVar63 = *(float *)(pauVar96[2] + 4);
        fVar64 = *(float *)(pauVar96[2] + 8);
        fVar65 = *(float *)(pauVar96[2] + 0xc);
        fVar66 = *(float *)(pauVar96[2] + 0x10);
        fVar67 = *(float *)(pauVar96[2] + 0x14);
        fVar68 = *(float *)(pauVar96[2] + 0x18);
        fVar9 = *(float *)pauVar95[2];
        fVar10 = *(float *)(pauVar95[2] + 4);
        fVar11 = *(float *)(pauVar95[2] + 8);
        fVar160 = *(float *)(*pauVar96 + 0x1c) + fVar11;
        fVar12 = *(float *)(pauVar95[2] + 0xc);
        fVar13 = *(float *)(pauVar95[2] + 0x10);
        fVar14 = *(float *)(pauVar95[2] + 0x14);
        fVar15 = *(float *)(pauVar95[2] + 0x18);
        fVar16 = *(float *)(pauVar95[2] + 0x1c);
        fVar69 = *(float *)pauVar96[3];
        fVar70 = *(float *)(pauVar96[3] + 4);
        fVar71 = *(float *)(pauVar96[3] + 8);
        fVar72 = *(float *)(pauVar96[3] + 0xc);
        fVar73 = *(float *)(pauVar96[3] + 0x10);
        fVar74 = *(float *)(pauVar96[3] + 0x14);
        fVar75 = *(float *)(pauVar96[3] + 0x18);
        fVar17 = *(float *)pauVar95[3];
        auVar123._0_4_ =
             fVar167 * fVar3 + auVar123._0_4_ + fVar9 * fVar62 + fVar55 * fVar157 + fVar17 * fVar69;
        auVar123._4_4_ =
             fVar168 * fVar3 + fVar19 + fVar9 * fVar63 + fVar56 * fVar157 + fVar17 * fVar70;
        auVar123._8_4_ =
             fVar169 * fVar3 + fVar25 + fVar9 * fVar64 + fVar57 * fVar157 + fVar17 * fVar71;
        auVar123._12_4_ =
             fVar170 * fVar3 + fVar31 + fVar9 * fVar65 + fVar58 * fVar157 + fVar17 * fVar72;
        auVar123._16_4_ =
             fVar52 * fVar3 + fVar37 + fVar9 * fVar66 + fVar59 * fVar157 + fVar17 * fVar73;
        auVar123._20_4_ =
             fVar53 * fVar3 + fVar43 + fVar9 * fVar67 + fVar60 * fVar157 + fVar17 * fVar74;
        auVar123._24_4_ =
             fVar54 * fVar3 + fVar49 + fVar9 * fVar68 + fVar61 * fVar157 + fVar17 * fVar75;
        auVar123._28_4_ = fVar3 + fVar164 + fVar9 + fVar157 + fVar17;
        fVar3 = *(float *)(pauVar95[3] + 4);
        auVar133._0_4_ =
             fVar167 * fVar161 + auVar133._0_4_ + fVar10 * fVar62 + fVar55 * fVar158 +
             fVar3 * fVar69;
        auVar133._4_4_ =
             fVar168 * fVar161 + fVar20 + fVar10 * fVar63 + fVar56 * fVar158 + fVar3 * fVar70;
        auVar133._8_4_ =
             fVar169 * fVar161 + fVar26 + fVar10 * fVar64 + fVar57 * fVar158 + fVar3 * fVar71;
        auVar133._12_4_ =
             fVar170 * fVar161 + fVar32 + fVar10 * fVar65 + fVar58 * fVar158 + fVar3 * fVar72;
        auVar133._16_4_ =
             fVar52 * fVar161 + fVar38 + fVar10 * fVar66 + fVar59 * fVar158 + fVar3 * fVar73;
        auVar133._20_4_ =
             fVar53 * fVar161 + fVar44 + fVar10 * fVar67 + fVar60 * fVar158 + fVar3 * fVar74;
        auVar133._24_4_ =
             fVar54 * fVar161 + fVar50 + fVar10 * fVar68 + fVar61 * fVar158 + fVar3 * fVar75;
        auVar133._28_4_ = fVar164 + fVar165 + fVar10 + fVar158 + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 8);
        auVar147._0_4_ =
             fVar159 * fVar55 + fVar11 * fVar62 + fVar167 * fVar162 + auVar147._0_4_ +
             fVar3 * fVar69;
        auVar147._4_4_ =
             fVar159 * fVar56 + fVar11 * fVar63 + fVar168 * fVar162 + fVar21 + fVar3 * fVar70;
        auVar147._8_4_ =
             fVar159 * fVar57 + fVar11 * fVar64 + fVar169 * fVar162 + fVar27 + fVar3 * fVar71;
        auVar147._12_4_ =
             fVar159 * fVar58 + fVar11 * fVar65 + fVar170 * fVar162 + fVar33 + fVar3 * fVar72;
        auVar147._16_4_ =
             fVar159 * fVar59 + fVar11 * fVar66 + fVar52 * fVar162 + fVar39 + fVar3 * fVar73;
        auVar147._20_4_ =
             fVar159 * fVar60 + fVar11 * fVar67 + fVar53 * fVar162 + fVar45 + fVar3 * fVar74;
        auVar147._24_4_ =
             fVar159 * fVar61 + fVar11 * fVar68 + fVar54 * fVar162 + fVar51 + fVar3 * fVar75;
        auVar147._28_4_ = fVar160 + fVar164 + fVar166 + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 0xc);
        fVar108 = fVar163 * fVar167 + fVar108 + fVar12 * fVar62 + fVar55 * fVar4 + fVar3 * fVar69;
        fVar115 = fVar163 * fVar168 + fVar115 + fVar12 * fVar63 + fVar56 * fVar4 + fVar3 * fVar70;
        fVar116 = fVar163 * fVar169 + fVar116 + fVar12 * fVar64 + fVar57 * fVar4 + fVar3 * fVar71;
        fVar117 = fVar163 * fVar170 + fVar117 + fVar12 * fVar65 + fVar58 * fVar4 + fVar3 * fVar72;
        fVar118 = fVar163 * fVar52 + fVar118 + fVar12 * fVar66 + fVar59 * fVar4 + fVar3 * fVar73;
        fVar119 = fVar163 * fVar53 + fVar119 + fVar12 * fVar67 + fVar60 * fVar4 + fVar3 * fVar74;
        fVar120 = fVar163 * fVar54 + fVar120 + fVar12 * fVar68 + fVar61 * fVar4 + fVar3 * fVar75;
        fVar122 = fVar164 + fVar122 + fVar160 + fStack_fc + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 0x10);
        auVar140._0_4_ =
             fVar167 * fVar153 + auVar140._0_4_ + fVar5 * fVar55 + fVar62 * fVar13 + fVar3 * fVar69;
        auVar140._4_4_ =
             fVar168 * fVar153 + fVar22 + fVar5 * fVar56 + fVar63 * fVar13 + fVar3 * fVar70;
        auVar140._8_4_ =
             fVar169 * fVar153 + fVar28 + fVar5 * fVar57 + fVar64 * fVar13 + fVar3 * fVar71;
        auVar140._12_4_ =
             fVar170 * fVar153 + fVar34 + fVar5 * fVar58 + fVar65 * fVar13 + fVar3 * fVar72;
        auVar140._16_4_ =
             fVar52 * fVar153 + fVar40 + fVar5 * fVar59 + fVar66 * fVar13 + fVar3 * fVar73;
        auVar140._20_4_ =
             fVar53 * fVar153 + fVar46 + fVar5 * fVar60 + fVar67 * fVar13 + fVar3 * fVar74;
        auVar140._24_4_ =
             fVar54 * fVar153 + fVar144 + fVar5 * fVar61 + fVar68 * fVar13 + fVar3 * fVar75;
        auVar140._28_4_ = fVar143 + fVar156 + fVar13 + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 0x14);
        auVar149._0_4_ =
             fVar154 * fVar167 + auVar149._0_4_ + fVar6 * fVar55 + fVar62 * fVar14 + fVar3 * fVar69;
        auVar149._4_4_ =
             fVar154 * fVar168 + fVar23 + fVar6 * fVar56 + fVar63 * fVar14 + fVar3 * fVar70;
        auVar149._8_4_ =
             fVar154 * fVar169 + fVar29 + fVar6 * fVar57 + fVar64 * fVar14 + fVar3 * fVar71;
        auVar149._12_4_ =
             fVar154 * fVar170 + fVar35 + fVar6 * fVar58 + fVar65 * fVar14 + fVar3 * fVar72;
        auVar149._16_4_ =
             fVar154 * fVar52 + fVar41 + fVar6 * fVar59 + fVar66 * fVar14 + fVar3 * fVar73;
        auVar149._20_4_ =
             fVar154 * fVar53 + fVar47 + fVar6 * fVar60 + fVar67 * fVar14 + fVar3 * fVar74;
        auVar149._24_4_ =
             fVar154 * fVar54 + fVar145 + fVar6 * fVar61 + fVar68 * fVar14 + fVar3 * fVar75;
        auVar149._28_4_ = fVar138 + fVar6 + fVar14 + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 0x18);
        auVar151._0_4_ =
             fVar7 * fVar55 + fVar62 * fVar15 + fVar155 * fVar167 + auVar151._0_4_ + fVar3 * fVar69;
        auVar151._4_4_ =
             fVar7 * fVar56 + fVar63 * fVar15 + fVar155 * fVar168 + fVar24 + fVar3 * fVar70;
        auVar151._8_4_ =
             fVar7 * fVar57 + fVar64 * fVar15 + fVar155 * fVar169 + fVar30 + fVar3 * fVar71;
        auVar151._12_4_ =
             fVar7 * fVar58 + fVar65 * fVar15 + fVar155 * fVar170 + fVar36 + fVar3 * fVar72;
        auVar151._16_4_ =
             fVar7 * fVar59 + fVar66 * fVar15 + fVar155 * fVar52 + fVar42 + fVar3 * fVar73;
        auVar151._20_4_ =
             fVar7 * fVar60 + fVar67 * fVar15 + fVar155 * fVar53 + fVar48 + fVar3 * fVar74;
        auVar151._24_4_ =
             fVar7 * fVar61 + fVar68 * fVar15 + fVar155 * fVar54 + fVar146 + fVar3 * fVar75;
        auVar151._28_4_ = fVar5 + fVar15 + fVar121 + fVar3;
        fVar3 = *(float *)(pauVar95[3] + 0x1c);
        auVar127._0_4_ = fVar55 * fVar8 + fVar62 * fVar16 + (float)local_118._0_4_ + fVar3 * fVar69;
        auVar127._4_4_ = fVar56 * fVar8 + fVar63 * fVar16 + (float)local_118._4_4_ + fVar3 * fVar70;
        auVar127._8_4_ = fVar57 * fVar8 + fVar64 * fVar16 + fStack_110 + fVar3 * fVar71;
        auVar127._12_4_ = fVar58 * fVar8 + fVar65 * fVar16 + fStack_10c + fVar3 * fVar72;
        auVar127._16_4_ = fVar59 * fVar8 + fVar66 * fVar16 + fStack_108 + fVar3 * fVar73;
        auVar127._20_4_ = fVar60 * fVar8 + fVar67 * fVar16 + fStack_104 + fVar3 * fVar74;
        auVar127._24_4_ = fVar61 * fVar8 + fVar68 * fVar16 + fStack_100 + fVar3 * fVar75;
        auVar127._28_4_ = fVar8 + fVar5 + fVar15 + fStack_fc + *(float *)(pauVar96[3] + 0x1c);
        pauVar95 = pauVar95 + 4;
        pauVar96 = pauVar96 + 4;
      }
      lVar85 = 0;
      for (; iVar81 < _h; iVar81 = iVar81 + 1) {
        fVar3 = *(float *)(*pauVar95 + lVar85);
        auVar113 = *(undefined1 (*) [32])(*pauVar96 + lVar85);
        fVar161 = auVar113._0_4_;
        fVar162 = auVar113._4_4_;
        fVar163 = auVar113._8_4_;
        fVar153 = auVar113._12_4_;
        fVar154 = auVar113._16_4_;
        fVar155 = auVar113._20_4_;
        fVar156 = auVar113._24_4_;
        auVar124._0_4_ = fVar161 * fVar3 + auVar123._0_4_;
        auVar124._4_4_ = fVar162 * fVar3 + auVar123._4_4_;
        auVar124._8_4_ = fVar163 * fVar3 + auVar123._8_4_;
        auVar124._12_4_ = fVar153 * fVar3 + auVar123._12_4_;
        auVar124._16_4_ = fVar154 * fVar3 + auVar123._16_4_;
        auVar124._20_4_ = fVar155 * fVar3 + auVar123._20_4_;
        auVar124._24_4_ = fVar156 * fVar3 + auVar123._24_4_;
        auVar124._28_4_ = fVar3 + auVar123._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 4);
        auVar134._0_4_ = fVar161 * fVar3 + auVar133._0_4_;
        auVar134._4_4_ = fVar162 * fVar3 + auVar133._4_4_;
        auVar134._8_4_ = fVar163 * fVar3 + auVar133._8_4_;
        auVar134._12_4_ = fVar153 * fVar3 + auVar133._12_4_;
        auVar134._16_4_ = fVar154 * fVar3 + auVar133._16_4_;
        auVar134._20_4_ = fVar155 * fVar3 + auVar133._20_4_;
        auVar134._24_4_ = fVar156 * fVar3 + auVar133._24_4_;
        auVar134._28_4_ = fVar3 + auVar133._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 8);
        auVar148._0_4_ = fVar161 * fVar3 + auVar147._0_4_;
        auVar148._4_4_ = fVar162 * fVar3 + auVar147._4_4_;
        auVar148._8_4_ = fVar163 * fVar3 + auVar147._8_4_;
        auVar148._12_4_ = fVar153 * fVar3 + auVar147._12_4_;
        auVar148._16_4_ = fVar154 * fVar3 + auVar147._16_4_;
        auVar148._20_4_ = fVar155 * fVar3 + auVar147._20_4_;
        auVar148._24_4_ = fVar156 * fVar3 + auVar147._24_4_;
        auVar148._28_4_ = fVar3 + auVar147._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 0xc);
        fVar108 = fVar161 * fVar3 + fVar108;
        fVar115 = fVar162 * fVar3 + fVar115;
        fVar116 = fVar163 * fVar3 + fVar116;
        fVar117 = fVar153 * fVar3 + fVar117;
        fVar118 = fVar154 * fVar3 + fVar118;
        fVar119 = fVar155 * fVar3 + fVar119;
        fVar120 = fVar156 * fVar3 + fVar120;
        fVar122 = fVar3 + fVar122;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 0x10);
        auVar141._0_4_ = fVar161 * fVar3 + auVar140._0_4_;
        auVar141._4_4_ = fVar162 * fVar3 + auVar140._4_4_;
        auVar141._8_4_ = fVar163 * fVar3 + auVar140._8_4_;
        auVar141._12_4_ = fVar153 * fVar3 + auVar140._12_4_;
        auVar141._16_4_ = fVar154 * fVar3 + auVar140._16_4_;
        auVar141._20_4_ = fVar155 * fVar3 + auVar140._20_4_;
        auVar141._24_4_ = fVar156 * fVar3 + auVar140._24_4_;
        auVar141._28_4_ = fVar3 + auVar140._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 0x14);
        auVar150._0_4_ = fVar161 * fVar3 + auVar149._0_4_;
        auVar150._4_4_ = fVar162 * fVar3 + auVar149._4_4_;
        auVar150._8_4_ = fVar163 * fVar3 + auVar149._8_4_;
        auVar150._12_4_ = fVar153 * fVar3 + auVar149._12_4_;
        auVar150._16_4_ = fVar154 * fVar3 + auVar149._16_4_;
        auVar150._20_4_ = fVar155 * fVar3 + auVar149._20_4_;
        auVar150._24_4_ = fVar156 * fVar3 + auVar149._24_4_;
        auVar150._28_4_ = fVar3 + auVar149._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 0x18);
        auVar152._0_4_ = fVar161 * fVar3 + auVar151._0_4_;
        auVar152._4_4_ = fVar162 * fVar3 + auVar151._4_4_;
        auVar152._8_4_ = fVar163 * fVar3 + auVar151._8_4_;
        auVar152._12_4_ = fVar153 * fVar3 + auVar151._12_4_;
        auVar152._16_4_ = fVar154 * fVar3 + auVar151._16_4_;
        auVar152._20_4_ = fVar155 * fVar3 + auVar151._20_4_;
        auVar152._24_4_ = fVar156 * fVar3 + auVar151._24_4_;
        auVar152._28_4_ = fVar3 + auVar151._28_4_;
        fVar3 = *(float *)(*pauVar95 + lVar85 + 0x1c);
        auVar128._0_4_ = fVar3 * fVar161 + auVar127._0_4_;
        auVar128._4_4_ = fVar3 * fVar162 + auVar127._4_4_;
        auVar128._8_4_ = fVar3 * fVar163 + auVar127._8_4_;
        auVar128._12_4_ = fVar3 * fVar153 + auVar127._12_4_;
        auVar128._16_4_ = fVar3 * fVar154 + auVar127._16_4_;
        auVar128._20_4_ = fVar3 * fVar155 + auVar127._20_4_;
        auVar128._24_4_ = fVar3 * fVar156 + auVar127._24_4_;
        auVar128._28_4_ = fVar3 + auVar127._28_4_;
        lVar85 = lVar85 + 0x20;
        auVar123 = auVar124;
        auVar127 = auVar128;
        auVar133 = auVar134;
        auVar140 = auVar141;
        auVar147 = auVar148;
        auVar149 = auVar150;
        auVar151 = auVar152;
      }
      *local_120 = auVar123;
      *pauVar87 = auVar133;
      *pauVar90 = auVar147;
      *(float *)*local_1f0 = fVar108;
      *(float *)(*local_1f0 + 4) = fVar115;
      *(float *)(*local_1f0 + 8) = fVar116;
      *(float *)(*local_1f0 + 0xc) = fVar117;
      *(float *)(*local_1f0 + 0x10) = fVar118;
      *(float *)(*local_1f0 + 0x14) = fVar119;
      *(float *)(*local_1f0 + 0x18) = fVar120;
      *(float *)(*local_1f0 + 0x1c) = fVar122;
      *local_1e0 = auVar140;
      *local_1d0 = auVar149;
      *local_1b8 = auVar151;
      *local_1c0 = auVar127;
      pauVar97 = local_120 + 1;
      pauVar87 = pauVar87 + 1;
      pauVar90 = pauVar90 + 1;
      local_1f0 = local_1f0 + 1;
      local_1e0 = local_1e0 + 1;
      local_1d0 = local_1d0 + 1;
      local_1b8 = local_1b8 + 1;
      local_1c0 = local_1c0 + 1;
    }
    for (; (int)uVar89 < (int)_w; uVar89 = uVar89 + 1) {
      Mat::channel(&local_178,&bottom_tm,(uVar89 & 7) + (uVar89 >> 3));
      pauVar96 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,iVar80);
      pauVar95 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      iVar81 = 0;
      fVar108 = 0.0;
      fVar115 = 0.0;
      fVar116 = 0.0;
      fVar117 = 0.0;
      fVar118 = 0.0;
      fVar119 = 0.0;
      fVar120 = 0.0;
      fVar122 = 0.0;
      auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar142 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
      while( true ) {
        if (_h <= iVar81 + 3) break;
        fVar3 = *(float *)*pauVar96;
        fVar161 = *(float *)(*pauVar96 + 4);
        fVar162 = *(float *)(*pauVar96 + 8);
        fVar163 = *(float *)(*pauVar96 + 0xc);
        fVar116 = fVar3 * *(float *)*pauVar95 + fVar116;
        fVar117 = fVar3 * *(float *)(*pauVar95 + 4) + fVar117;
        fVar108 = fVar3 * *(float *)(*pauVar95 + 8) + fVar108;
        fVar115 = fVar3 * *(float *)(*pauVar95 + 0xc) + fVar115;
        fVar118 = fVar3 * *(float *)(*pauVar95 + 0x10) + fVar118;
        fVar119 = fVar3 * *(float *)(*pauVar95 + 0x14) + fVar119;
        fVar120 = fVar3 * *(float *)(*pauVar95 + 0x18) + fVar120;
        fVar122 = fVar3 + fVar122;
        auVar131 = ZEXT3264(CONCAT428(fVar3 + auVar131._28_4_,
                                      CONCAT424(fVar161 * *(float *)(pauVar95[1] + 0x18) +
                                                auVar131._24_4_,
                                                CONCAT420(fVar161 * *(float *)(pauVar95[1] + 0x14) +
                                                          auVar131._20_4_,
                                                          CONCAT416(fVar161 * *(float *)(pauVar95[1]
                                                                                        + 0x10) +
                                                                    auVar131._16_4_,
                                                                    CONCAT412(fVar161 * *(float *)(
                                                  pauVar95[1] + 0xc) + auVar131._12_4_,
                                                  CONCAT48(fVar161 * *(float *)(pauVar95[1] + 8) +
                                                           auVar131._8_4_,
                                                           CONCAT44(fVar161 * *(float *)(pauVar95[1]
                                                                                        + 4) +
                                                                    auVar131._4_4_,
                                                                    fVar161 * *(float *)pauVar95[1]
                                                                    + auVar131._0_4_))))))));
        auVar142 = ZEXT3264(CONCAT428(fVar161 + auVar142._28_4_,
                                      CONCAT424(fVar162 * *(float *)(pauVar95[2] + 0x18) +
                                                auVar142._24_4_,
                                                CONCAT420(fVar162 * *(float *)(pauVar95[2] + 0x14) +
                                                          auVar142._20_4_,
                                                          CONCAT416(fVar162 * *(float *)(pauVar95[2]
                                                                                        + 0x10) +
                                                                    auVar142._16_4_,
                                                                    CONCAT412(fVar162 * *(float *)(
                                                  pauVar95[2] + 0xc) + auVar142._12_4_,
                                                  CONCAT48(fVar162 * *(float *)(pauVar95[2] + 8) +
                                                           auVar142._8_4_,
                                                           CONCAT44(fVar162 * *(float *)(pauVar95[2]
                                                                                        + 4) +
                                                                    auVar142._4_4_,
                                                                    fVar162 * *(float *)pauVar95[2]
                                                                    + auVar142._0_4_))))))));
        auVar137 = ZEXT3264(CONCAT428(fVar3 + auVar137._28_4_,
                                      CONCAT424(fVar163 * *(float *)(pauVar95[3] + 0x18) +
                                                auVar137._24_4_,
                                                CONCAT420(fVar163 * *(float *)(pauVar95[3] + 0x14) +
                                                          auVar137._20_4_,
                                                          CONCAT416(fVar163 * *(float *)(pauVar95[3]
                                                                                        + 0x10) +
                                                                    auVar137._16_4_,
                                                                    CONCAT412(fVar163 * *(float *)(
                                                  pauVar95[3] + 0xc) + auVar137._12_4_,
                                                  CONCAT48(fVar163 * *(float *)(pauVar95[3] + 8) +
                                                           auVar137._8_4_,
                                                           CONCAT44(fVar163 * *(float *)(pauVar95[3]
                                                                                        + 4) +
                                                                    auVar137._4_4_,
                                                                    fVar163 * *(float *)pauVar95[3]
                                                                    + auVar137._0_4_))))))));
        pauVar95 = pauVar95 + 4;
        pauVar96 = (undefined1 (*) [32])(*pauVar96 + 0x10);
        iVar81 = iVar81 + 4;
      }
      auVar113._0_4_ = fVar116 + *pfVar86 + auVar131._0_4_ + auVar142._0_4_ + auVar137._0_4_;
      auVar113._4_4_ = fVar117 + pfVar86[1] + auVar131._4_4_ + auVar142._4_4_ + auVar137._4_4_;
      auVar113._8_4_ = fVar108 + pfVar86[2] + auVar131._8_4_ + auVar142._8_4_ + auVar137._8_4_;
      auVar113._12_4_ = fVar115 + pfVar86[3] + auVar131._12_4_ + auVar142._12_4_ + auVar137._12_4_;
      auVar113._16_4_ = fVar118 + pfVar86[4] + auVar131._16_4_ + auVar142._16_4_ + auVar137._16_4_;
      auVar113._20_4_ = fVar119 + pfVar86[5] + auVar131._20_4_ + auVar142._20_4_ + auVar137._20_4_;
      auVar113._24_4_ = fVar120 + pfVar86[6] + auVar131._24_4_ + auVar142._24_4_ + auVar137._24_4_;
      auVar113._28_4_ = fVar122 + pfVar86[7] + auVar131._28_4_ + auVar142._28_4_ + auVar137._28_4_;
      lVar85 = 0;
      while( true ) {
        if (_h <= iVar81) break;
        fVar108 = *(float *)(*pauVar96 + lVar85);
        pfVar2 = (float *)(*pauVar95 + lVar85 * 8);
        auVar114._0_4_ = fVar108 * *pfVar2 + auVar113._0_4_;
        auVar114._4_4_ = fVar108 * pfVar2[1] + auVar113._4_4_;
        auVar114._8_4_ = fVar108 * pfVar2[2] + auVar113._8_4_;
        auVar114._12_4_ = fVar108 * pfVar2[3] + auVar113._12_4_;
        auVar114._16_4_ = fVar108 * pfVar2[4] + auVar113._16_4_;
        auVar114._20_4_ = fVar108 * pfVar2[5] + auVar113._20_4_;
        auVar114._24_4_ = fVar108 * pfVar2[6] + auVar113._24_4_;
        auVar114._28_4_ = fVar108 + auVar113._28_4_;
        iVar81 = iVar81 + 1;
        lVar85 = lVar85 + 4;
        auVar113 = auVar114;
      }
      *(float *)*pauVar97 = auVar113._0_4_;
      auVar109 = auVar113._0_16_;
      uVar18 = vextractps_avx(auVar109,1);
      *(undefined4 *)*pauVar87 = uVar18;
      uVar18 = vextractps_avx(auVar109,2);
      *(undefined4 *)*pauVar90 = uVar18;
      uVar18 = vextractps_avx(auVar109,3);
      *(undefined4 *)*local_1f0 = uVar18;
      auVar109 = auVar113._16_16_;
      *(float *)*local_1e0 = auVar113._16_4_;
      uVar18 = vextractps_avx(auVar109,1);
      *(undefined4 *)*local_1d0 = uVar18;
      uVar18 = vextractps_avx(auVar109,2);
      *(undefined4 *)*local_1b8 = uVar18;
      uVar18 = vextractps_avx(auVar109,3);
      *(undefined4 *)*local_1c0 = uVar18;
      pauVar97 = (undefined1 (*) [32])(*pauVar97 + 4);
      pauVar87 = (undefined1 (*) [32])(*pauVar87 + 4);
      pauVar90 = (undefined1 (*) [32])(*pauVar90 + 4);
      local_1f0 = (undefined1 (*) [32])(*local_1f0 + 4);
      local_1e0 = (undefined1 (*) [32])(*local_1e0 + 4);
      local_1d0 = (undefined1 (*) [32])(*local_1d0 + 4);
      local_1b8 = (undefined1 (*) [32])(*local_1b8 + 4);
      local_1c0 = (undefined1 (*) [32])(*local_1c0 + 4);
    }
  }
  uVar89 = uVar106 >> 2 & 1;
  for (uVar92 = 0; pMVar78 = local_128, uVar92 != uVar89; uVar92 = uVar92 + 1) {
    uVar103 = local_f8 + uVar92 * 4;
    uVar106 = (uint)uVar103;
    Mat::channel(&local_178,local_128,uVar106);
    pauVar87 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar106 | 1);
    pauVar90 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar106 | 2);
    pauVar97 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    Mat::channel(&local_178,pMVar78,uVar106 | 3);
    pauVar96 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    pfVar86 = (float *)((long)local_130 + uVar103 * 4);
    if (local_130 == (void *)0x0) {
      pfVar86 = zeros;
    }
    uVar103 = (ulong)(uint)((int)uVar106 >> 0x1f) << 0x20 | uVar103 & 0xffffffff;
    local_118._0_4_ = ((int)((long)uVar103 % 8) >> 2) + (int)((long)uVar103 / 8);
    for (uVar106 = 0; (int)(uVar106 | 7) < (int)_w; uVar106 = uVar106 + 8) {
      Mat::channel(&local_178,&bottom_tm,uVar106 >> 3);
      pauVar95 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,local_118._0_4_);
      pauVar94 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      fVar108 = *pfVar86;
      fVar115 = pfVar86[1];
      auVar125._4_4_ = fVar115;
      auVar125._0_4_ = fVar115;
      auVar125._8_4_ = fVar115;
      auVar125._12_4_ = fVar115;
      auVar125._16_4_ = fVar115;
      auVar125._20_4_ = fVar115;
      auVar125._24_4_ = fVar115;
      auVar125._28_4_ = fVar115;
      fVar115 = pfVar86[2];
      auVar129._4_4_ = fVar115;
      auVar129._0_4_ = fVar115;
      auVar129._8_4_ = fVar115;
      auVar129._12_4_ = fVar115;
      auVar129._16_4_ = fVar115;
      auVar129._20_4_ = fVar115;
      auVar129._24_4_ = fVar115;
      auVar129._28_4_ = fVar115;
      fVar115 = pfVar86[3];
      auVar135._4_4_ = fVar115;
      auVar135._0_4_ = fVar115;
      auVar135._8_4_ = fVar115;
      auVar135._12_4_ = fVar115;
      auVar135._16_4_ = fVar115;
      auVar135._20_4_ = fVar115;
      auVar135._24_4_ = fVar115;
      auVar135._28_4_ = fVar115;
      fVar115 = fVar108;
      fVar116 = fVar108;
      fVar117 = fVar108;
      fVar118 = fVar108;
      fVar119 = fVar108;
      fVar120 = fVar108;
      fVar122 = fVar108;
      for (iVar80 = 0; iVar80 + 3 < _h; iVar80 = iVar80 + 4) {
        fVar3 = *(float *)*pauVar94;
        fVar161 = *(float *)(*pauVar94 + 4);
        fVar162 = *(float *)(*pauVar94 + 8);
        fVar163 = *(float *)(*pauVar94 + 0xc);
        fVar38 = *(float *)*pauVar95;
        fVar39 = *(float *)(*pauVar95 + 4);
        fVar40 = *(float *)(*pauVar95 + 8);
        fVar41 = *(float *)(*pauVar95 + 0xc);
        fVar42 = *(float *)(*pauVar95 + 0x10);
        fVar43 = *(float *)(*pauVar95 + 0x14);
        fVar44 = *(float *)(*pauVar95 + 0x18);
        fVar45 = *(float *)pauVar95[1];
        fVar46 = *(float *)(pauVar95[1] + 4);
        fVar47 = *(float *)(pauVar95[1] + 8);
        fVar48 = *(float *)(pauVar95[1] + 0xc);
        fVar49 = *(float *)(pauVar95[1] + 0x10);
        fVar50 = *(float *)(pauVar95[1] + 0x14);
        fVar51 = *(float *)(pauVar95[1] + 0x18);
        auVar113 = pauVar95[2];
        fVar9 = auVar125._4_4_;
        fVar12 = auVar125._8_4_;
        fVar15 = auVar125._12_4_;
        fVar19 = auVar125._16_4_;
        fVar22 = auVar125._20_4_;
        fVar25 = auVar125._24_4_;
        fVar28 = auVar125._28_4_;
        fVar10 = auVar129._4_4_;
        fVar13 = auVar129._8_4_;
        fVar16 = auVar129._12_4_;
        fVar20 = auVar129._16_4_;
        fVar23 = auVar129._20_4_;
        fVar26 = auVar129._24_4_;
        fVar29 = auVar129._28_4_;
        fVar11 = auVar135._4_4_;
        fVar14 = auVar135._8_4_;
        fVar17 = auVar135._12_4_;
        fVar21 = auVar135._16_4_;
        fVar24 = auVar135._20_4_;
        fVar27 = auVar135._24_4_;
        fVar30 = auVar135._28_4_;
        fVar153 = *(float *)(*pauVar94 + 0x10);
        fVar154 = *(float *)(*pauVar94 + 0x14);
        fVar155 = *(float *)(*pauVar94 + 0x18);
        fVar156 = *(float *)(*pauVar94 + 0x1c);
        fVar157 = *(float *)pauVar94[1];
        fVar158 = *(float *)(pauVar94[1] + 4);
        fVar159 = *(float *)(pauVar94[1] + 8);
        fVar4 = *(float *)(pauVar94[1] + 0xc);
        auVar114 = pauVar95[3];
        fVar31 = auVar113._0_4_;
        fVar32 = auVar113._4_4_;
        fVar33 = auVar113._8_4_;
        fVar34 = auVar113._12_4_;
        fVar35 = auVar113._16_4_;
        fVar36 = auVar113._20_4_;
        fVar37 = auVar113._24_4_;
        fVar144 = fVar154 + fVar157 + fVar153;
        fVar145 = fVar155 + fVar144;
        fVar146 = fVar156 + fVar145;
        fVar5 = *(float *)(pauVar94[1] + 0x10);
        fVar6 = *(float *)(pauVar94[1] + 0x14);
        fVar7 = *(float *)(pauVar94[1] + 0x18);
        fVar8 = *(float *)(pauVar94[1] + 0x1c);
        fVar164 = auVar114._0_4_;
        fVar165 = auVar114._4_4_;
        fVar166 = auVar114._8_4_;
        fVar167 = auVar114._12_4_;
        fVar168 = auVar114._16_4_;
        fVar169 = auVar114._20_4_;
        fVar170 = auVar114._24_4_;
        fVar108 = fVar38 * fVar3 + fVar108 + fVar157 * fVar31 + fVar45 * fVar153 + fVar164 * fVar5;
        fVar115 = fVar39 * fVar3 + fVar115 + fVar157 * fVar32 + fVar46 * fVar153 + fVar165 * fVar5;
        fVar116 = fVar40 * fVar3 + fVar116 + fVar157 * fVar33 + fVar47 * fVar153 + fVar166 * fVar5;
        fVar117 = fVar41 * fVar3 + fVar117 + fVar157 * fVar34 + fVar48 * fVar153 + fVar167 * fVar5;
        fVar118 = fVar42 * fVar3 + fVar118 + fVar157 * fVar35 + fVar49 * fVar153 + fVar168 * fVar5;
        fVar119 = fVar43 * fVar3 + fVar119 + fVar157 * fVar36 + fVar50 * fVar153 + fVar169 * fVar5;
        fVar120 = fVar44 * fVar3 + fVar120 + fVar157 * fVar37 + fVar51 * fVar153 + fVar170 * fVar5;
        fVar122 = fVar3 + fVar122 + fVar157 + fVar153 + fVar146;
        auVar125._0_4_ =
             fVar38 * fVar161 + auVar125._0_4_ + fVar45 * fVar154 + fVar158 * fVar31 +
             fVar164 * fVar6;
        auVar125._4_4_ =
             fVar39 * fVar161 + fVar9 + fVar46 * fVar154 + fVar158 * fVar32 + fVar165 * fVar6;
        auVar125._8_4_ =
             fVar40 * fVar161 + fVar12 + fVar47 * fVar154 + fVar158 * fVar33 + fVar166 * fVar6;
        auVar125._12_4_ =
             fVar41 * fVar161 + fVar15 + fVar48 * fVar154 + fVar158 * fVar34 + fVar167 * fVar6;
        auVar125._16_4_ =
             fVar42 * fVar161 + fVar19 + fVar49 * fVar154 + fVar158 * fVar35 + fVar168 * fVar6;
        auVar125._20_4_ =
             fVar43 * fVar161 + fVar22 + fVar50 * fVar154 + fVar158 * fVar36 + fVar169 * fVar6;
        auVar125._24_4_ =
             fVar44 * fVar161 + fVar25 + fVar51 * fVar154 + fVar158 * fVar37 + fVar170 * fVar6;
        auVar125._28_4_ = fVar3 + fVar28 + fVar144 + fVar146;
        auVar129._0_4_ =
             fVar38 * fVar162 + auVar129._0_4_ + fVar45 * fVar155 + fVar159 * fVar31 +
             fVar164 * fVar7;
        auVar129._4_4_ =
             fVar39 * fVar162 + fVar10 + fVar46 * fVar155 + fVar159 * fVar32 + fVar165 * fVar7;
        auVar129._8_4_ =
             fVar40 * fVar162 + fVar13 + fVar47 * fVar155 + fVar159 * fVar33 + fVar166 * fVar7;
        auVar129._12_4_ =
             fVar41 * fVar162 + fVar16 + fVar48 * fVar155 + fVar159 * fVar34 + fVar167 * fVar7;
        auVar129._16_4_ =
             fVar42 * fVar162 + fVar20 + fVar49 * fVar155 + fVar159 * fVar35 + fVar168 * fVar7;
        auVar129._20_4_ =
             fVar43 * fVar162 + fVar23 + fVar50 * fVar155 + fVar159 * fVar36 + fVar169 * fVar7;
        auVar129._24_4_ =
             fVar44 * fVar162 + fVar26 + fVar51 * fVar155 + fVar159 * fVar37 + fVar170 * fVar7;
        auVar129._28_4_ = fVar3 + fVar29 + fVar145 + fVar146;
        auVar135._0_4_ =
             fVar38 * fVar163 + auVar135._0_4_ + fVar45 * fVar156 + fVar4 * fVar31 + fVar8 * fVar164
        ;
        auVar135._4_4_ =
             fVar39 * fVar163 + fVar11 + fVar46 * fVar156 + fVar4 * fVar32 + fVar8 * fVar165;
        auVar135._8_4_ =
             fVar40 * fVar163 + fVar14 + fVar47 * fVar156 + fVar4 * fVar33 + fVar8 * fVar166;
        auVar135._12_4_ =
             fVar41 * fVar163 + fVar17 + fVar48 * fVar156 + fVar4 * fVar34 + fVar8 * fVar167;
        auVar135._16_4_ =
             fVar42 * fVar163 + fVar21 + fVar49 * fVar156 + fVar4 * fVar35 + fVar8 * fVar168;
        auVar135._20_4_ =
             fVar43 * fVar163 + fVar24 + fVar50 * fVar156 + fVar4 * fVar36 + fVar8 * fVar169;
        auVar135._24_4_ =
             fVar44 * fVar163 + fVar27 + fVar51 * fVar156 + fVar4 * fVar37 + fVar8 * fVar170;
        auVar135._28_4_ = fVar3 + fVar30 + fVar146 + fVar146;
        pauVar94 = pauVar94 + 2;
        pauVar95 = pauVar95 + 4;
      }
      lVar85 = 0;
      for (; iVar80 < _h; iVar80 = iVar80 + 1) {
        fVar3 = *(float *)(*pauVar94 + lVar85);
        fVar161 = *(float *)(*pauVar94 + lVar85 + 4);
        fVar162 = *(float *)(*pauVar94 + lVar85 + 8);
        fVar163 = *(float *)(*pauVar94 + lVar85 + 0xc);
        auVar113 = *(undefined1 (*) [32])(*pauVar95 + lVar85 * 2);
        fVar153 = auVar113._0_4_;
        fVar154 = auVar113._4_4_;
        fVar155 = auVar113._8_4_;
        fVar156 = auVar113._12_4_;
        fVar157 = auVar113._16_4_;
        fVar158 = auVar113._20_4_;
        fVar159 = auVar113._24_4_;
        fVar108 = fVar153 * fVar3 + fVar108;
        fVar115 = fVar154 * fVar3 + fVar115;
        fVar116 = fVar155 * fVar3 + fVar116;
        fVar117 = fVar156 * fVar3 + fVar117;
        fVar118 = fVar157 * fVar3 + fVar118;
        fVar119 = fVar158 * fVar3 + fVar119;
        fVar120 = fVar159 * fVar3 + fVar120;
        fVar122 = fVar3 + fVar122;
        auVar126._0_4_ = fVar153 * fVar161 + auVar125._0_4_;
        auVar126._4_4_ = fVar154 * fVar161 + auVar125._4_4_;
        auVar126._8_4_ = fVar155 * fVar161 + auVar125._8_4_;
        auVar126._12_4_ = fVar156 * fVar161 + auVar125._12_4_;
        auVar126._16_4_ = fVar157 * fVar161 + auVar125._16_4_;
        auVar126._20_4_ = fVar158 * fVar161 + auVar125._20_4_;
        auVar126._24_4_ = fVar159 * fVar161 + auVar125._24_4_;
        auVar126._28_4_ = fVar3 + auVar125._28_4_;
        auVar130._0_4_ = fVar153 * fVar162 + auVar129._0_4_;
        auVar130._4_4_ = fVar154 * fVar162 + auVar129._4_4_;
        auVar130._8_4_ = fVar155 * fVar162 + auVar129._8_4_;
        auVar130._12_4_ = fVar156 * fVar162 + auVar129._12_4_;
        auVar130._16_4_ = fVar157 * fVar162 + auVar129._16_4_;
        auVar130._20_4_ = fVar158 * fVar162 + auVar129._20_4_;
        auVar130._24_4_ = fVar159 * fVar162 + auVar129._24_4_;
        auVar130._28_4_ = fVar3 + auVar129._28_4_;
        auVar136._0_4_ = fVar153 * fVar163 + auVar135._0_4_;
        auVar136._4_4_ = fVar154 * fVar163 + auVar135._4_4_;
        auVar136._8_4_ = fVar155 * fVar163 + auVar135._8_4_;
        auVar136._12_4_ = fVar156 * fVar163 + auVar135._12_4_;
        auVar136._16_4_ = fVar157 * fVar163 + auVar135._16_4_;
        auVar136._20_4_ = fVar158 * fVar163 + auVar135._20_4_;
        auVar136._24_4_ = fVar159 * fVar163 + auVar135._24_4_;
        auVar136._28_4_ = fVar3 + auVar135._28_4_;
        lVar85 = lVar85 + 0x10;
        auVar125 = auVar126;
        auVar129 = auVar130;
        auVar135 = auVar136;
      }
      *(float *)*pauVar87 = fVar108;
      *(float *)(*pauVar87 + 4) = fVar115;
      *(float *)(*pauVar87 + 8) = fVar116;
      *(float *)(*pauVar87 + 0xc) = fVar117;
      *(float *)(*pauVar87 + 0x10) = fVar118;
      *(float *)(*pauVar87 + 0x14) = fVar119;
      *(float *)(*pauVar87 + 0x18) = fVar120;
      *(float *)(*pauVar87 + 0x1c) = fVar122;
      *pauVar90 = auVar125;
      *pauVar97 = auVar129;
      *pauVar96 = auVar135;
      pauVar87 = pauVar87 + 1;
      pauVar90 = pauVar90 + 1;
      pauVar97 = pauVar97 + 1;
      pauVar96 = pauVar96 + 1;
    }
    for (; (int)uVar106 < (int)_w; uVar106 = uVar106 + 1) {
      Mat::channel(&local_178,&bottom_tm,(uVar106 & 7) + (uVar106 >> 3));
      pauVar95 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,local_118._0_4_);
      pauVar94 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      iVar80 = 0;
      fVar108 = 0.0;
      fVar115 = 0.0;
      fVar116 = 0.0;
      fVar117 = 0.0;
      auVar109 = ZEXT816(0) << 0x40;
      auVar139 = ZEXT816(0) << 0x40;
      auVar132 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar162 = auVar109._4_4_;
        fVar163 = auVar109._8_4_;
        fVar153 = auVar109._12_4_;
        fVar119 = auVar139._4_4_;
        fVar122 = auVar139._8_4_;
        fVar3 = auVar139._12_4_;
        fVar118 = auVar132._4_4_;
        fVar120 = auVar132._8_4_;
        fVar161 = auVar132._12_4_;
        if (_h <= iVar80 + 3) break;
        fVar154 = *(float *)*pauVar95;
        fVar155 = *(float *)(*pauVar95 + 4);
        fVar156 = *(float *)(*pauVar95 + 8);
        fVar157 = *(float *)(*pauVar95 + 0xc);
        fVar108 = fVar154 * *(float *)*pauVar94 + fVar108;
        fVar115 = fVar154 * *(float *)(*pauVar94 + 4) + fVar115;
        fVar116 = fVar154 * *(float *)(*pauVar94 + 8) + fVar116;
        fVar117 = fVar154 * *(float *)(*pauVar94 + 0xc) + fVar117;
        auVar109._0_4_ = fVar155 * *(float *)(*pauVar94 + 0x10) + auVar109._0_4_;
        auVar109._4_4_ = fVar155 * *(float *)(*pauVar94 + 0x14) + fVar162;
        auVar109._8_4_ = fVar155 * *(float *)(*pauVar94 + 0x18) + fVar163;
        auVar109._12_4_ = fVar155 * *(float *)(*pauVar94 + 0x1c) + fVar153;
        auVar139._0_4_ = fVar156 * *(float *)pauVar94[1] + auVar139._0_4_;
        auVar139._4_4_ = fVar156 * *(float *)(pauVar94[1] + 4) + fVar119;
        auVar139._8_4_ = fVar156 * *(float *)(pauVar94[1] + 8) + fVar122;
        auVar139._12_4_ = fVar156 * *(float *)(pauVar94[1] + 0xc) + fVar3;
        auVar132._0_4_ = fVar157 * *(float *)(pauVar94[1] + 0x10) + auVar132._0_4_;
        auVar132._4_4_ = fVar157 * *(float *)(pauVar94[1] + 0x14) + fVar118;
        auVar132._8_4_ = fVar157 * *(float *)(pauVar94[1] + 0x18) + fVar120;
        auVar132._12_4_ = fVar157 * *(float *)(pauVar94[1] + 0x1c) + fVar161;
        pauVar94 = pauVar94 + 2;
        pauVar95 = (undefined1 (*) [32])(*pauVar95 + 0x10);
        iVar80 = iVar80 + 4;
      }
      auVar110._0_4_ = fVar108 + *pfVar86 + auVar109._0_4_ + auVar139._0_4_ + auVar132._0_4_;
      auVar110._4_4_ = fVar115 + pfVar86[1] + fVar162 + fVar119 + fVar118;
      auVar110._8_4_ = fVar116 + pfVar86[2] + fVar163 + fVar122 + fVar120;
      auVar110._12_4_ = fVar117 + pfVar86[3] + fVar153 + fVar3 + fVar161;
      lVar85 = 0;
      for (; iVar80 < _h; iVar80 = iVar80 + 1) {
        fVar108 = *(float *)(*pauVar95 + lVar85);
        pfVar2 = (float *)(*pauVar94 + lVar85 * 4);
        auVar111._0_4_ = fVar108 * *pfVar2 + auVar110._0_4_;
        auVar111._4_4_ = fVar108 * pfVar2[1] + auVar110._4_4_;
        auVar111._8_4_ = fVar108 * pfVar2[2] + auVar110._8_4_;
        auVar111._12_4_ = fVar108 * pfVar2[3] + auVar110._12_4_;
        lVar85 = lVar85 + 4;
        auVar110 = auVar111;
      }
      *(float *)*pauVar87 = auVar110._0_4_;
      uVar18 = vextractps_avx(auVar110,1);
      *(undefined4 *)*pauVar90 = uVar18;
      uVar18 = vextractps_avx(auVar110,2);
      *(undefined4 *)*pauVar97 = uVar18;
      uVar18 = vextractps_avx(auVar110,3);
      *(undefined4 *)*pauVar96 = uVar18;
      pauVar87 = (undefined1 (*) [32])(*pauVar87 + 4);
      pauVar90 = (undefined1 (*) [32])(*pauVar90 + 4);
      pauVar97 = (undefined1 (*) [32])(*pauVar97 + 4);
      pauVar96 = (undefined1 (*) [32])(*pauVar96 + 4);
    }
  }
  for (uVar92 = (ulong)(int)((int)local_f8 + uVar89 * 4); (long)uVar92 < (long)local_f0;
      uVar92 = uVar92 + 1) {
    Mat::channel(&local_178,local_128,(int)uVar92);
    pauVar97 = (undefined1 (*) [32])local_178.data;
    Mat::~Mat(&local_178);
    if (local_130 == (void *)0x0) {
      _local_118 = ZEXT816(0) << 0x40;
    }
    else {
      _local_118 = ZEXT416(*(uint *)((long)local_130 + uVar92 * 4));
    }
    uVar89 = (int)uVar92 >> 0x1f;
    uVar103 = (ulong)uVar89 << 0x20 | uVar92 & 0xffffffff;
    iVar80 = (int)((long)((ulong)uVar89 << 0x20 | uVar92 & 0xffffffff) % 4) +
             (int)((long)uVar103 / 8) + (int)(char)((char)((long)uVar103 % 8) / '\x04');
    auVar109 = vshufps_avx(_local_118,_local_118,0);
    for (uVar103 = 0; (int)((uint)uVar103 | 7) < (int)_w; uVar103 = (ulong)((uint)uVar103 + 8)) {
      Mat::channel(&local_178,&bottom_tm,(int)(uVar103 >> 3));
      pauVar87 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,iVar80);
      pauVar90 = (undefined1 (*) [32])local_178.data;
      Mat::~Mat(&local_178);
      local_1a8 = auVar109._0_4_;
      fStack_1a4 = auVar109._4_4_;
      fStack_1a0 = auVar109._8_4_;
      fStack_19c = auVar109._12_4_;
      fVar108 = local_1a8;
      fVar115 = fStack_1a4;
      fVar116 = fStack_1a0;
      fVar117 = fStack_19c;
      for (iVar81 = 0; iVar81 + 3 < _h; iVar81 = iVar81 + 4) {
        fVar118 = *(float *)*pauVar90;
        fVar119 = *(float *)(*pauVar90 + 4);
        fVar120 = *(float *)(*pauVar90 + 8);
        fVar122 = *(float *)(*pauVar90 + 0xc);
        local_1a8 = fVar118 * *(float *)*pauVar87 + local_1a8 +
                    fVar119 * *(float *)pauVar87[1] + fVar120 * *(float *)pauVar87[2] +
                    fVar122 * *(float *)pauVar87[3];
        fStack_1a4 = fVar118 * *(float *)(*pauVar87 + 4) + fStack_1a4 +
                     fVar119 * *(float *)(pauVar87[1] + 4) + fVar120 * *(float *)(pauVar87[2] + 4) +
                     fVar122 * *(float *)(pauVar87[3] + 4);
        fStack_1a0 = fVar118 * *(float *)(*pauVar87 + 8) + fStack_1a0 +
                     fVar119 * *(float *)(pauVar87[1] + 8) + fVar120 * *(float *)(pauVar87[2] + 8) +
                     fVar122 * *(float *)(pauVar87[3] + 8);
        fStack_19c = fVar118 * *(float *)(*pauVar87 + 0xc) + fStack_19c +
                     fVar119 * *(float *)(pauVar87[1] + 0xc) +
                     fVar120 * *(float *)(pauVar87[2] + 0xc) +
                     fVar122 * *(float *)(pauVar87[3] + 0xc);
        fVar108 = fVar118 * *(float *)(*pauVar87 + 0x10) + fVar108 +
                  fVar119 * *(float *)(pauVar87[1] + 0x10) +
                  fVar120 * *(float *)(pauVar87[2] + 0x10) +
                  fVar122 * *(float *)(pauVar87[3] + 0x10);
        fVar115 = fVar118 * *(float *)(*pauVar87 + 0x14) + fVar115 +
                  fVar119 * *(float *)(pauVar87[1] + 0x14) +
                  fVar120 * *(float *)(pauVar87[2] + 0x14) +
                  fVar122 * *(float *)(pauVar87[3] + 0x14);
        fVar116 = fVar118 * *(float *)(*pauVar87 + 0x18) + fVar116 +
                  fVar119 * *(float *)(pauVar87[1] + 0x18) +
                  fVar120 * *(float *)(pauVar87[2] + 0x18) +
                  fVar122 * *(float *)(pauVar87[3] + 0x18);
        fVar117 = fVar118 + fVar117 + fVar118 + fVar119 + fVar118 + fVar119;
        pauVar90 = (undefined1 (*) [32])(*pauVar90 + 0x10);
        pauVar87 = pauVar87 + 4;
      }
      lVar85 = 0;
      for (; iVar81 < _h; iVar81 = iVar81 + 1) {
        fVar118 = *(float *)(*pauVar90 + lVar85);
        pfVar86 = (float *)(*pauVar87 + lVar85 * 8);
        local_1a8 = fVar118 * *pfVar86 + local_1a8;
        fStack_1a4 = fVar118 * pfVar86[1] + fStack_1a4;
        fStack_1a0 = fVar118 * pfVar86[2] + fStack_1a0;
        fStack_19c = fVar118 * pfVar86[3] + fStack_19c;
        fVar108 = fVar118 * pfVar86[4] + fVar108;
        fVar115 = fVar118 * pfVar86[5] + fVar115;
        fVar116 = fVar118 * pfVar86[6] + fVar116;
        fVar117 = fVar118 + fVar117;
        lVar85 = lVar85 + 4;
      }
      *(float *)*pauVar97 = local_1a8;
      *(float *)(*pauVar97 + 4) = fStack_1a4;
      *(float *)(*pauVar97 + 8) = fStack_1a0;
      *(float *)(*pauVar97 + 0xc) = fStack_19c;
      *(float *)(*pauVar97 + 0x10) = fVar108;
      *(float *)(*pauVar97 + 0x14) = fVar115;
      *(float *)(*pauVar97 + 0x18) = fVar116;
      *(float *)(*pauVar97 + 0x1c) = fVar117;
      pauVar97 = pauVar97 + 1;
    }
    while (uVar89 = (uint)uVar103, (int)uVar89 < (int)_w) {
      Mat::channel(&local_178,&bottom_tm,(uVar89 & 7) + (int)(uVar103 >> 3));
      pvVar76 = local_178.data;
      Mat::~Mat(&local_178);
      Mat::channel(&local_178,kernel_tm,iVar80);
      pvVar77 = local_178.data;
      Mat::~Mat(&local_178);
      lVar85 = 0;
      pauVar87 = (undefined1 (*) [32])pvVar76;
      pauVar90 = (undefined1 (*) [32])pvVar77;
      auVar109 = ZEXT816(0) << 0x40;
      for (iVar81 = 0; iVar81 + 3 < _h; iVar81 = iVar81 + 4) {
        auVar112._0_4_ = *(float *)*pauVar90 * *(float *)*pauVar87 + auVar109._0_4_;
        auVar112._4_4_ = *(float *)(*pauVar90 + 4) * *(float *)(*pauVar87 + 4) + auVar109._4_4_;
        auVar112._8_4_ = *(float *)(*pauVar90 + 8) * *(float *)(*pauVar87 + 8) + auVar109._8_4_;
        auVar112._12_4_ =
             *(float *)(*pauVar90 + 0xc) * *(float *)(*pauVar87 + 0xc) + auVar109._12_4_;
        pauVar90 = (undefined1 (*) [32])(*pauVar90 + 0x10);
        pauVar87 = (undefined1 (*) [32])(*pauVar87 + 0x10);
        lVar85 = lVar85 + 4;
        auVar109 = auVar112;
      }
      auVar109 = vhaddps_avx(auVar109,auVar109);
      auVar109 = vhaddps_avx(auVar109,auVar109);
      fVar108 = auVar109._0_4_ + (float)local_118._0_4_;
      for (; (int)lVar85 < _h; lVar85 = lVar85 + 1) {
        fVar108 = *(float *)((undefined1 *)pvVar76 + lVar85 * 4) *
                  *(float *)((undefined1 *)pvVar77 + lVar85 * 4) + fVar108;
      }
      *(float *)*pauVar97 = fVar108;
      pauVar97 = (undefined1 (*) [32])(*pauVar97 + 4);
      uVar103 = (ulong)(uVar89 + 1);
    }
  }
  Mat::~Mat(&bottom_tm);
  Mat::~Mat(&bottom_im2col);
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias,
                                  const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw * outh, kernel_h * kernel_w * inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h * kernel_w * outw * outh;
        float* ret = (float*)bottom_im2col;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }

    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb + 4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb + 8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb + 12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};

                int k = 0;
                for (; k + 7 < L; k = k + 8)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 4];
                        sum1[n] += va[1] * vb[n + 4];
                        sum2[n] += va[2] * vb[n + 4];
                        sum3[n] += va[3] * vb[n + 4];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 8];
                        sum1[n] += va[1] * vb[n + 8];
                        sum2[n] += va[2] * vb[n + 8];
                        sum3[n] += va[3] * vb[n + 8];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 12];
                        sum1[n] += va[1] * vb[n + 12];
                        sum2[n] += va[2] * vb[n + 12];
                        sum3[n] += va[3] * vb[n + 12];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 16];
                        sum1[n] += va[1] * vb[n + 16];
                        sum2[n] += va[2] * vb[n + 16];
                        sum3[n] += va[3] * vb[n + 16];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 20];
                        sum1[n] += va[1] * vb[n + 20];
                        sum2[n] += va[2] * vb[n + 20];
                        sum3[n] += va[3] * vb[n + 20];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 24];
                        sum1[n] += va[1] * vb[n + 24];
                        sum2[n] += va[2] * vb[n + 24];
                        sum3[n] += va[3] * vb[n + 24];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 28];
                        sum1[n] += va[1] * vb[n + 28];
                        sum2[n] += va[2] * vb[n + 28];
                        sum3[n] += va[3] * vb[n + 28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va + 4);
                    __m128 _va2 = _mm_loadu_ps(va + 8);
                    __m128 _va3 = _mm_loadu_ps(va + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0)); // sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1)); // sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2)); // sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3)); // sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k < L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va);

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0)); // sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }

                float sum0_3_tmp[4];
                _mm_storeu_ps(sum0_3_tmp, _sum0_3);
                output0[0] = sum0_3_tmp[0];
                output1[0] = sum0_3_tmp[1];
                output2[0] = sum0_3_tmp[2];
                output3[0] = sum0_3_tmp[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k = 0; k < L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb + 4);
                    __m128 _vb2 = _mm_loadu_ps(vb + 8);
                    __m128 _vb3 = _mm_loadu_ps(vb + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1)); // sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2)); // sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3)); // sum0 += (a30-a33) * k03

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0);
#else
                float sum[4] = {0};

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n + 4];
                        sum[n] += va[2] * vb[n + 8];
                        sum[n] += va[3] * vb[n + 12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);

                int k = 0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k + 3 < L; k += 4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;
                }
                float sum0_tmp[4];
                _mm_storeu_ps(sum0_tmp, _sum0);
                float sum0 = bias0 + sum0_tmp[0] + sum0_tmp[1] + sum0_tmp[2] + sum0_tmp[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k < L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }
}